

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimPatValues(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  Vec_Wrd_t *__ptr;
  Vec_Wrd_t *pVVar5;
  word *__s;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar8 = p->vSimsPi->nSize / p->vCis->nSize;
  __ptr = Gia_ManSimPatSim(p);
  pVVar2 = p->vCos;
  lVar7 = (long)iVar8;
  lVar9 = pVVar2->nSize * lVar7;
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = (int)lVar9;
  iVar6 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar6 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar6 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar3;
  memset(__s,0,lVar9 * 8);
  if (p->vSimsPi->nSize != p->vCis->nSize * iVar8) {
    __assert_fail("Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x9b,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  if (iVar3 != pVVar2->nSize * iVar8) {
    __assert_fail("Vec_WrdSize(vValues) == nWords * Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x9c,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  iVar6 = __ptr->nSize;
  if (iVar6 != p->nObjs * iVar8) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x9d,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      iVar1 = pVVar2->pArray[lVar10];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar1 == 0) break;
      if ((((lVar9 < 0) || (iVar3 <= lVar9)) || (uVar4 = iVar1 * iVar8, (int)uVar4 < 0)) ||
         (iVar6 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      memcpy(__s + lVar9,__ptr->pArray + uVar4,lVar7 * 8);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + lVar7;
    } while (lVar10 < pVVar2->nSize);
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatValues( Gia_Man_t * p )
{
    int i, Id, nWords   = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    Vec_Wrd_t * vSims   = Gia_ManSimPatSim( p ); 
    Vec_Wrd_t * vValues = Vec_WrdStart( Gia_ManCoNum(p)  * nWords ); 
    assert( Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)  );
    assert( Vec_WrdSize(vValues)    == nWords * Gia_ManCoNum(p)  );
    assert( Vec_WrdSize(vSims)      == nWords * Gia_ManObjNum(p) );
    Gia_ManForEachCoId( p, Id, i )
        memcpy( Vec_WrdEntryP(vValues, nWords * i), Vec_WrdEntryP(vSims, nWords * Id), sizeof(word)* nWords );
    Vec_WrdFree( vSims );
    return vValues;
}